

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::runner
          (runner<ApprovalTests::cfg::reporter,_16> *this)

{
  string_view filter;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  size_t sVar2;
  void *in_RDI;
  reporter *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  memset(in_RDI,0,0x240);
  ApprovalTests::cfg::reporter::reporter(in_stack_ffffffffffffffa0);
  memset((void *)((long)in_RDI + 0x240),0,0x18);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::vector
            ((vector<void_(*)(),_std::allocator<void_(*)()>_> *)0x10c1a0);
  *(undefined8 *)((long)in_RDI + 600) = 0;
  *(undefined1 *)((long)in_RDI + 0x260) = 0;
  *(undefined8 *)((long)in_RDI + 0x268) = 0;
  pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)((long)in_RDI + 0x270);
  do {
    local_30 = pbVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_30);
    pbVar1 = local_30 + 1;
  } while (local_30 + 1 !=
           (basic_string_view<char,_std::char_traits<char>_> *)((long)in_RDI + 0x370));
  sVar2 = (long)in_RDI + 0x370;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_18);
  filter._M_str = (char *)local_30;
  filter._M_len = sVar2;
  runner<ApprovalTests::cfg::reporter,_16>::filter::filter
            ((filter *)in_stack_ffffffffffffffa0,filter);
  memset((void *)((long)in_RDI + 0x388),0,0x18);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x10c25a);
  *(undefined1 *)((long)in_RDI + 0x3a0) = 0;
  return;
}

Assistant:

constexpr runner() = default;